

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_store_scalar(Parser *this,csubstr s,flag_t is_quoted)

{
  State *pSVar1;
  code *pcVar2;
  bool bVar3;
  
  if ((this->m_state->flags & 0x200) != 0) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00240518)
              ("check failed: has_none(SSCL)",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  pSVar1 = this->m_state;
  pSVar1->flags = is_quoted << 10 | pSVar1->flags | 0x200;
  (pSVar1->scalar).str = s.str;
  (pSVar1->scalar).len = s.len;
  return;
}

Assistant:

void Parser::_store_scalar(csubstr s, flag_t is_quoted)
{
    _c4dbgpf("state[{}]: storing scalar '{}' (flag: {}) (old scalar='{}')",
             m_state-m_stack.begin(), s, m_state->flags & SSCL, m_state->scalar);
    RYML_CHECK(has_none(SSCL));
    add_flags(SSCL | (is_quoted * QSCL));
    m_state->scalar = s;
}